

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v4.cpp
# Opt level: O1

void __thiscall
LASwriteItemCompressed_POINT14_v4::LASwriteItemCompressed_POINT14_v4
          (LASwriteItemCompressed_POINT14_v4 *this,ArithmeticEncoder *enc)

{
  BOOL *pBVar1;
  BOOL *pBVar2;
  long lVar3;
  long lVar4;
  
  (this->super_LASwriteItemCompressed).super_LASwriteItem._vptr_LASwriteItem =
       (_func_int **)&PTR_write_0015f488;
  pBVar1 = &this->contexts[0].last_X_diff_median5[0].high;
  pBVar2 = &this->contexts[0].last_Y_diff_median5[0].high;
  lVar3 = 0xd0;
  do {
    lVar4 = 0;
    do {
      *(undefined8 *)(pBVar1 + lVar4 + -0x14) = 0;
      *(undefined8 *)(pBVar1 + lVar4 + -0x14 + 8) = 0;
      *(undefined4 *)(pBVar1 + lVar4 + -4) = 0;
      pBVar1[lVar4] = true;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x120);
    lVar4 = 0;
    do {
      *(undefined8 *)(pBVar2 + lVar4 + -0x14) = 0;
      *(undefined8 *)(pBVar2 + lVar4 + -0x14 + 8) = 0;
      *(undefined4 *)(pBVar2 + lVar4 + -4) = 0;
      pBVar2[lVar4] = true;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x120);
    lVar3 = lVar3 + 0xad8;
    pBVar1 = pBVar1 + 0xad8;
    pBVar2 = pBVar2 + 0xad8;
  } while (lVar3 != 0x2c30);
  if (enc != (ArithmeticEncoder *)0x0) {
    this->enc = enc;
    memset(&this->outstream_channel_returns_XY,0,0x97);
    lVar3 = 0x3c8;
    do {
      *(undefined8 *)
       ((long)&(this->super_LASwriteItemCompressed).super_LASwriteItem._vptr_LASwriteItem + lVar3) =
           0;
      lVar3 = lVar3 + 0xad8;
    } while (lVar3 != 0x2f28);
    this->num_bytes_intensity = 0;
    this->num_bytes_scan_angle = 0;
    this->num_bytes_user_data = 0;
    this->num_bytes_point_source = 0;
    this->num_bytes_channel_returns_XY = 0;
    this->num_bytes_Z = 0;
    this->num_bytes_classification = 0;
    this->num_bytes_flags = 0;
    this->num_bytes_gps_time = 0;
    this->current_context = 0;
    return;
  }
  __assert_fail("enc",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/laswriteitemcompressed_v4.cpp"
                ,0x5d,
                "LASwriteItemCompressed_POINT14_v4::LASwriteItemCompressed_POINT14_v4(ArithmeticEncoder *)"
               );
}

Assistant:

LASwriteItemCompressed_POINT14_v4::LASwriteItemCompressed_POINT14_v4(ArithmeticEncoder* enc)
{
  /* not used as a encoder. just gives access to outstream */

  assert(enc);
  this->enc = enc;

  /* zero outstreams and encoders */

  outstream_channel_returns_XY = 0;
  outstream_Z = 0;
  outstream_classification = 0;
  outstream_flags = 0;
  outstream_intensity = 0;
  outstream_scan_angle = 0;
  outstream_user_data = 0;
  outstream_point_source = 0;
  outstream_gps_time = 0;

  changed_classification = FALSE;
  changed_flags = FALSE;
  changed_intensity = FALSE;
  changed_scan_angle = FALSE;
  changed_user_data = FALSE;
  changed_point_source = FALSE;
  changed_gps_time = FALSE;

  enc_channel_returns_XY = 0;
  enc_Z = 0;
  enc_classification = 0;
  enc_flags = 0;
  enc_intensity = 0;
  enc_scan_angle = 0;
  enc_user_data = 0;
  enc_point_source = 0;
  enc_gps_time = 0;

  /* mark the four scanner channel contexts as uninitialized */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    contexts[c].m_changed_values[0] = 0;
  }
  current_context = 0;

  /* number of bytes per layer */
  
  num_bytes_channel_returns_XY = 0;
  num_bytes_Z = 0;
  num_bytes_classification = 0;
  num_bytes_flags = 0;
  num_bytes_intensity = 0;
  num_bytes_scan_angle = 0;
  num_bytes_user_data = 0;
  num_bytes_point_source = 0;
  num_bytes_gps_time = 0;
}